

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O2

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var2;
  _Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p_Var3;
  size_type sVar4;
  bool bVar5;
  __type _Var6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Encoding encoding;
  uint uVar10;
  cmsysProcess *cp;
  pointer pbVar11;
  string *psVar12;
  char *pcVar13;
  pointer pvVar14;
  _Alloc_hider _Var15;
  cmMakefile *pcVar16;
  ostream *poVar17;
  vector<char,_std::allocator<char>_> *output;
  int idx;
  size_t i;
  ulong uVar18;
  pointer pvVar19;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_*,_std::vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>_>,_bool>
  pVar20;
  string_view arg;
  string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  static_string_view name_11;
  static_string_view name_12;
  static_string_view name_13;
  static_string_view name_14;
  cmProcessOutput processOutput;
  string echo_output;
  string strdata;
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  char *data;
  double timeout;
  char buf [16];
  unique_ptr<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)> cp_ptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  _Vector_base<char,_std::allocator<char>_> local_a0;
  _Vector_base<char,_std::allocator<char>_> local_88;
  string local_70;
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&arguments,"called with incorrect number of arguments",
               (allocator<char> *)&echo_output);
    cmCommand::SetError(&this->super_cmCommand,(string *)&arguments);
    std::__cxx11::string::~string((string *)&arguments);
    return false;
  }
  if ((InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar9 = __cxa_guard_acquire(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar9 != 0)) {
    echo_output.field_2._M_allocated_capacity = 0;
    echo_output._M_dataplus._M_p = (pointer)0x0;
    echo_output._M_string_length = 0;
    arguments.Commands.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arguments.Commands.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arguments.OutputVariable._M_dataplus._M_p =
         (pointer)std::
                  _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:71:18)>
                  ::_M_invoke;
    arguments.Commands.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(ArgumentParser::Instance_&,_void_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h:71:18)>
                  ::_M_manager;
    name._M_str = "COMMAND";
    name._M_len = 7;
    pVar20 = ArgumentParser::ActionMap::Emplace((ActionMap *)&echo_output,name,(Action *)&arguments)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
    if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("inserted",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmArgumentParser.h"
                    ,0x4b,
                    "cmArgumentParser<Result> &cmArgumentParser<Arguments>::Bind(cm::static_string_view, T Result::*) [Result = Arguments, T = std::vector<std::vector<std::basic_string<char>>>]"
                   );
    }
    name_00.super_string_view._M_str = "COMMAND_ECHO";
    name_00.super_string_view._M_len = 0xc;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_00,0x138);
    name_01.super_string_view._M_str = "OUTPUT_VARIABLE";
    name_01.super_string_view._M_len = 0xf;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_01,0x18);
    name_02.super_string_view._M_str = "ERROR_VARIABLE";
    name_02.super_string_view._M_len = 0xe;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_02,0x38);
    name_03.super_string_view._M_str = "RESULT_VARIABLE";
    name_03.super_string_view._M_len = 0xf;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_03,0x58);
    name_04.super_string_view._M_str = "RESULTS_VARIABLE";
    name_04.super_string_view._M_len = 0x10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_04,0x78);
    name_05.super_string_view._M_str = "WORKING_DIRECTORY";
    name_05.super_string_view._M_len = 0x11;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_05,0x98);
    name_06.super_string_view._M_str = "INPUT_FILE";
    name_06.super_string_view._M_len = 10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_06,0xb8);
    name_07.super_string_view._M_str = "OUTPUT_FILE";
    name_07.super_string_view._M_len = 0xb;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_07,0xd8);
    name_08.super_string_view._M_str = "ERROR_FILE";
    name_08.super_string_view._M_len = 10;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_08,0xf8);
    name_09.super_string_view._M_str = "TIMEOUT";
    name_09.super_string_view._M_len = 7;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_09,0x118);
    name_10.super_string_view._M_str = "OUTPUT_QUIET";
    name_10.super_string_view._M_len = 0xc;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&echo_output,name_10,0x158);
    name_11.super_string_view._M_str = "ERROR_QUIET";
    name_11.super_string_view._M_len = 0xb;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&echo_output,name_11,0x159);
    name_12.super_string_view._M_str = "OUTPUT_STRIP_TRAILING_WHITESPACE";
    name_12.super_string_view._M_len = 0x20;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&echo_output,name_12,0x15a);
    name_13.super_string_view._M_str = "ERROR_STRIP_TRAILING_WHITESPACE";
    name_13.super_string_view._M_len = 0x1f;
    cmArgumentParser<Arguments>::Bind<bool>
              ((cmArgumentParser<Arguments> *)&echo_output,name_13,0x15b);
    name_14.super_string_view._M_str = "ENCODING";
    name_14.super_string_view._M_len = 8;
    cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExecuteProcessCommand::InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)&echo_output,name_14,0x160);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)&InitialPass::parser,
             (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
              *)&echo_output);
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
               *)&echo_output);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&InitialPass::parser,&__dso_handle);
    __cxa_guard_release(&InitialPass(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keywordsMissingValue.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.Commands.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.Commands.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.Commands.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.OutputVariable._M_dataplus._M_p = (pointer)&arguments.OutputVariable.field_2;
  arguments.OutputVariable._M_string_length = 0;
  arguments.OutputVariable.field_2._M_local_buf[0] = '\0';
  arguments.ErrorVariable._M_dataplus._M_p = (pointer)&arguments.ErrorVariable.field_2;
  arguments.ErrorVariable._M_string_length = 0;
  arguments.ErrorVariable.field_2._M_local_buf[0] = '\0';
  arguments.ResultVariable._M_dataplus._M_p = (pointer)&arguments.ResultVariable.field_2;
  arguments.ResultVariable._M_string_length = 0;
  arguments.ResultVariable.field_2._M_local_buf[0] = '\0';
  arguments.ResultsVariable._M_dataplus._M_p = (pointer)&arguments.ResultsVariable.field_2;
  arguments.ResultsVariable._M_string_length = 0;
  arguments.ResultsVariable.field_2._M_local_buf[0] = '\0';
  arguments.WorkingDirectory._M_dataplus._M_p = (pointer)&arguments.WorkingDirectory.field_2;
  arguments.WorkingDirectory._M_string_length = 0;
  arguments.WorkingDirectory.field_2._M_local_buf[0] = '\0';
  arguments.InputFile._M_dataplus._M_p = (pointer)&arguments.InputFile.field_2;
  arguments.InputFile._M_string_length = 0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.InputFile.field_2._M_local_buf[0] = '\0';
  arguments.OutputFile._M_dataplus._M_p = (pointer)&arguments.OutputFile.field_2;
  arguments.OutputFile._M_string_length = 0;
  keywordsMissingValue.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keywordsMissingValue.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  arguments.OutputFile.field_2._M_local_buf[0] = '\0';
  arguments.ErrorFile._M_dataplus._M_p = (pointer)&arguments.ErrorFile.field_2;
  arguments.ErrorFile._M_string_length = 0;
  arguments.ErrorFile.field_2._M_local_buf[0] = '\0';
  arguments.Timeout._M_dataplus._M_p = (pointer)&arguments.Timeout.field_2;
  arguments.Timeout._M_string_length = 0;
  arguments.Timeout.field_2._M_local_buf[0] = '\0';
  arguments.CommandEcho._M_dataplus._M_p = (pointer)&arguments.CommandEcho.field_2;
  arguments.CommandEcho._M_string_length = 0;
  arguments.CommandEcho.field_2._M_local_buf[0] = '\0';
  arguments.Encoding._M_dataplus._M_p = (pointer)&arguments.Encoding.field_2;
  arguments.OutputQuiet = false;
  arguments.ErrorQuiet = false;
  arguments.OutputStripTrailingWhitespace = false;
  arguments.ErrorStripTrailingWhitespace = false;
  arguments.Encoding._M_string_length = 0;
  arguments.Encoding.field_2._M_local_buf[0] = '\0';
  echo_output._M_dataplus._M_p = (pointer)&InitialPass::parser;
  echo_output._M_string_length = 0;
  echo_output.field_2._M_allocated_capacity = 0;
  echo_output.field_2._M_local_buf[8] = '\0';
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar11 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
      pbVar11 = pbVar11 + 1) {
    arg._M_str = (pbVar11->_M_dataplus)._M_p;
    arg._M_len = pbVar11->_M_string_length;
    ArgumentParser::Instance::Consume
              ((Instance *)&echo_output,arg,&arguments,&unparsedArguments,&keywordsMissingValue);
  }
  if (keywordsMissingValue.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      keywordsMissingValue.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (unparsedArguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        unparsedArguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      psVar12 = &arguments.OutputFile;
      bVar5 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,psVar12);
      if (!bVar5) {
        std::operator+(&strdata,"attempted to output into a file: ",psVar12);
        std::operator+(&echo_output,&strdata," into a source directory.");
        cmCommand::SetError(&this->super_cmCommand,&echo_output);
        std::__cxx11::string::~string((string *)&echo_output);
        std::__cxx11::string::~string((string *)&strdata);
        cmSystemTools::s_FatalErrorOccured = true;
        goto LAB_001c9e8f;
      }
      pvVar14 = arguments.Commands.
                super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (arguments.Commands.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          arguments.Commands.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001c9f02:
        if (pvVar14 !=
            arguments.Commands.
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto code_r0x001c9f0b;
        timeout = -1.0;
        if ((arguments.Timeout._M_string_length != 0) &&
           (iVar9 = __isoc99_sscanf(arguments.Timeout._M_dataplus._M_p,"%lg",&timeout), iVar9 != 1))
        {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&echo_output," called with TIMEOUT value that could not be parsed.",
                     (allocator<char> *)&strdata);
          cmCommand::SetError(&this->super_cmCommand,&echo_output);
          goto LAB_001ca1a5;
        }
        cp = cmsysProcess_New();
        pvVar14 = arguments.Commands.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        cp_ptr._M_t.super___uniq_ptr_impl<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)>._M_t.
        super__Tuple_impl<0UL,_cmsysProcess_s_*,_void_(*)(cmsysProcess_s_*)>.
        super__Tuple_impl<1UL,_void_(*)(cmsysProcess_s_*)>.
        super__Head_base<1UL,_void_(*)(cmsysProcess_s_*),_false>._M_head_impl =
             (_Head_base<1UL,_void_(*)(cmsysProcess_s_*),_false>)cmsysProcess_Delete;
        cp_ptr._M_t.super___uniq_ptr_impl<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)>._M_t.
        super__Tuple_impl<0UL,_cmsysProcess_s_*,_void_(*)(cmsysProcess_s_*)>.
        super__Head_base<0UL,_cmsysProcess_s_*,_false>._M_head_impl = cp;
        for (pvVar19 = arguments.Commands.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pvVar19 != pvVar14;
            pvVar19 = pvVar19 + 1) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)&echo_output,
                     ((long)(pvVar19->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar19->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) + 1,
                     (allocator_type *)&strdata);
          pbVar1 = (pvVar19->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          _Var15 = echo_output._M_dataplus;
          for (pbVar11 = (pvVar19->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar1;
              pbVar11 = pbVar11 + 1) {
            *(pointer *)_Var15._M_p = (pbVar11->_M_dataplus)._M_p;
            _Var15._M_p = _Var15._M_p + 8;
          }
          *(undefined8 *)(echo_output._M_string_length - 8) = 0;
          cmsysProcess_AddCommand(cp,(char **)echo_output._M_dataplus._M_p);
          std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                    ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)&echo_output);
        }
        if (arguments.WorkingDirectory._M_string_length != 0) {
          cmsysProcess_SetWorkingDirectory(cp,arguments.WorkingDirectory._M_dataplus._M_p);
        }
        cmsysProcess_SetOption(cp,0,1);
        if (arguments.InputFile._M_string_length != 0) {
          cmsysProcess_SetPipeFile(cp,1,arguments.InputFile._M_dataplus._M_p);
        }
        if (arguments.OutputFile._M_string_length != 0) {
          cmsysProcess_SetPipeFile(cp,2,arguments.OutputFile._M_dataplus._M_p);
        }
        if (arguments.ErrorFile._M_string_length == 0) {
LAB_001ca144:
          bVar5 = false;
        }
        else {
          _Var6 = std::operator==(&arguments.ErrorFile,psVar12);
          bVar5 = true;
          if (!_Var6) {
            cmsysProcess_SetPipeFile(cp,3,arguments.ErrorFile._M_dataplus._M_p);
            goto LAB_001ca144;
          }
        }
        if (arguments.OutputVariable._M_string_length == 0) {
          if (bVar5) goto LAB_001ca16a;
LAB_001ca1b3:
          bVar5 = false;
        }
        else {
          _Var6 = std::operator==(&arguments.OutputVariable,&arguments.ErrorVariable);
          if (!_Var6 && !bVar5) goto LAB_001ca1b3;
LAB_001ca16a:
          bVar5 = true;
          cmsysProcess_SetOption(cp,2,1);
        }
        if (0.0 <= timeout) {
          cmsysProcess_SetTimeout(cp,timeout);
        }
        pcVar16 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&strdata,"CMAKE_EXECUTE_PROCESS_COMMAND_ECHO",(allocator<char> *)buf);
        psVar12 = cmMakefile::GetSafeDefinition(pcVar16,&strdata);
        std::__cxx11::string::string((string *)&echo_output,(string *)psVar12);
        std::__cxx11::string::~string((string *)&strdata);
        sVar4 = arguments.CommandEcho._M_string_length;
        if (arguments.CommandEcho._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&echo_output);
        }
        if (echo_output._M_string_length != 0) {
          bVar7 = std::operator==(&echo_output,"STDERR");
          if ((bVar7) || (bVar8 = std::operator==(&echo_output,"STDOUT"), bVar8)) {
            pvVar14 = arguments.Commands.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
            strdata._M_string_length = 0;
            strdata.field_2._M_local_buf[0] = '\0';
            for (pvVar19 = arguments.Commands.
                           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pvVar19 != pvVar14;
                pvVar19 = pvVar19 + 1) {
              std::__cxx11::string::append((char *)&strdata);
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)buf,pvVar19,"\' \'");
              std::__cxx11::string::append((string *)&strdata);
              std::__cxx11::string::~string((string *)buf);
              std::__cxx11::string::append((char *)&strdata);
              std::__cxx11::string::append((char *)&strdata);
            }
            if (bVar7) {
              poVar17 = (ostream *)&std::cerr;
            }
            else {
              poVar17 = (ostream *)&std::cout;
            }
            std::operator<<(poVar17,(string *)&strdata);
            std::__cxx11::string::~string((string *)&strdata);
            goto LAB_001ca32e;
          }
          bVar7 = std::operator!=(&echo_output,"NONE");
          if (!bVar7) goto LAB_001ca32e;
          strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
          strdata._M_string_length = 0;
          strdata.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::assign((char *)&strdata);
          std::__cxx11::string::append((string *)&strdata);
          std::__cxx11::string::append((char *)&strdata);
          if (sVar4 != 0) {
            std::__cxx11::string::append((char *)&strdata);
          }
          cmMakefile::IssueMessage((this->super_cmCommand).Makefile,FATAL_ERROR,&strdata);
          std::__cxx11::string::~string((string *)&strdata);
          goto LAB_001ca96b;
        }
LAB_001ca32e:
        cmsysProcess_Execute(cp);
        tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        encoding = cmProcessOutput::FindEncoding(&arguments.Encoding);
        cmProcessOutput::cmProcessOutput(&processOutput,encoding,0x400);
        strdata._M_dataplus._M_p = (pointer)&strdata.field_2;
        strdata._M_string_length = 0;
        strdata.field_2._M_local_buf[0] = '\0';
LAB_001ca3a9:
        do {
          while( true ) {
            iVar9 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0);
            if (iVar9 != 2) break;
            if (arguments.OutputQuiet == false) {
              output = &tempOutput;
              if (arguments.OutputVariable._M_string_length == 0) {
                cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,1);
                cmSystemTools::Stdout(&strdata);
              }
              else {
LAB_001ca416:
                cmExecuteProcessCommandAppend(output,data,length);
              }
            }
          }
          if (iVar9 == 3) {
            if (arguments.ErrorQuiet == false) {
              output = &tempError;
              if (arguments.ErrorVariable._M_string_length != 0) goto LAB_001ca416;
              cmProcessOutput::DecodeText(&processOutput,data,(long)length,&strdata,2);
              cmSystemTools::Stderr(&strdata);
            }
            goto LAB_001ca3a9;
          }
          if (iVar9 == 0) {
            if ((arguments.OutputQuiet == false) && (arguments.OutputVariable._M_string_length == 0)
               ) {
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              local_50._M_string_length = 0;
              local_50.field_2._M_local_buf[0] = '\0';
              cmProcessOutput::DecodeText(&processOutput,&local_50,&strdata,1);
              std::__cxx11::string::~string((string *)&local_50);
              if (strdata._M_string_length != 0) {
                cmSystemTools::Stdout(&strdata);
              }
            }
            if ((arguments.ErrorQuiet == false) && (arguments.ErrorVariable._M_string_length == 0))
            {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              local_70._M_string_length = 0;
              local_70.field_2._M_local_buf[0] = '\0';
              cmProcessOutput::DecodeText(&processOutput,&local_70,&strdata,2);
              std::__cxx11::string::~string((string *)&local_70);
              if (strdata._M_string_length != 0) {
                cmSystemTools::Stderr(&strdata);
              }
            }
            cmsysProcess_WaitForExit(cp,(double *)0x0);
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&local_88,&tempOutput);
            cmProcessOutput::DecodeText
                      (&processOutput,(vector<char,_std::allocator<char>_> *)&local_88,&tempOutput,0
                      );
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_88);
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&local_a0,&tempError);
            cmProcessOutput::DecodeText
                      (&processOutput,(vector<char,_std::allocator<char>_> *)&local_a0,&tempError,0)
            ;
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_a0);
            cmExecuteProcessCommandFixText(&tempOutput,arguments.OutputStripTrailingWhitespace);
            cmExecuteProcessCommandFixText(&tempError,arguments.ErrorStripTrailingWhitespace);
            if ((arguments.OutputVariable._M_string_length != 0) &&
               (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish)) {
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&arguments.OutputVariable,
                         tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
            }
            if ((!bVar5 && arguments.ErrorVariable._M_string_length != 0) &&
               (tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish)) {
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&arguments.ErrorVariable,
                         tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
            }
            if (arguments.ResultVariable._M_string_length == 0) goto switchD_001ca663_caseD_3;
            iVar9 = cmsysProcess_GetState(cp);
            switch(iVar9) {
            case 1:
              pcVar16 = (this->super_cmCommand).Makefile;
              pcVar13 = cmsysProcess_GetErrorString(cp);
              goto LAB_001ca76e;
            case 2:
              pcVar16 = (this->super_cmCommand).Makefile;
              pcVar13 = cmsysProcess_GetExceptionString(cp);
LAB_001ca76e:
              cmMakefile::AddDefinition(pcVar16,&arguments.ResultVariable,pcVar13);
              break;
            case 4:
              uVar10 = cmsysProcess_GetExitValue(cp);
              sprintf(buf,"%d",(ulong)uVar10);
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&arguments.ResultVariable,buf);
              break;
            case 5:
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&arguments.ResultVariable,
                         "Process terminated due to timeout");
            }
switchD_001ca663_caseD_3:
            if (arguments.ResultsVariable._M_string_length == 0) goto switchD_001ca7d0_caseD_3;
            iVar9 = cmsysProcess_GetState(cp);
            switch(iVar9) {
            case 1:
              pcVar16 = (this->super_cmCommand).Makefile;
              pcVar13 = cmsysProcess_GetErrorString(cp);
              goto LAB_001ca8b5;
            case 2:
              pcVar16 = (this->super_cmCommand).Makefile;
              pcVar13 = cmsysProcess_GetExceptionString(cp);
LAB_001ca8b5:
              cmMakefile::AddDefinition(pcVar16,&arguments.ResultsVariable,pcVar13);
              break;
            case 4:
              res.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              res.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              res.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              for (uVar18 = 0;
                  uVar18 < (ulong)(((long)arguments.Commands.
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)arguments.Commands.
                                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
                  uVar18 = uVar18 + 1) {
                idx = (int)uVar18;
                iVar9 = cmsysProcess_GetStateByIndex(cp,idx);
                if (iVar9 == 2) {
                  buf._0_8_ = cmsysProcess_GetExceptionStringByIndex(cp,idx);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const*>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &res,(char **)buf);
                }
                else if (iVar9 == 4) {
                  uVar10 = cmsysProcess_GetExitValueByIndex(cp,idx);
                  sprintf(buf,"%d",(ulong)uVar10);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char(&)[16]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &res,&buf);
                }
                else {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[36]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &res,(char (*) [36])"Error getting the child return code");
                }
              }
              pcVar16 = (this->super_cmCommand).Makefile;
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)buf,&res,";");
              cmMakefile::AddDefinition(pcVar16,&arguments.ResultsVariable,(char *)buf._0_8_);
              std::__cxx11::string::~string((string *)buf);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&res);
              break;
            case 5:
              cmMakefile::AddDefinition
                        ((this->super_cmCommand).Makefile,&arguments.ResultsVariable,
                         "Process terminated due to timeout");
            }
switchD_001ca7d0_caseD_3:
            std::__cxx11::string::~string((string *)&strdata);
            cmProcessOutput::~cmProcessOutput(&processOutput);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      (&tempError.super__Vector_base<char,_std::allocator<char>_>);
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                      (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
LAB_001ca96b:
            std::__cxx11::string::~string((string *)&echo_output);
            std::unique_ptr<cmsysProcess_s,_void_(*)(cmsysProcess_s_*)>::~unique_ptr(&cp_ptr);
            bVar5 = true;
            goto LAB_001c9e91;
          }
        } while( true );
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&echo_output," called with no COMMAND argument.",
                 (allocator<char> *)&strdata);
      cmCommand::SetError(&this->super_cmCommand,&echo_output);
      goto LAB_001ca1a5;
    }
    std::operator+(&strdata," given unknown argument \"",
                   unparsedArguments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+(&echo_output,&strdata,"\".");
    cmCommand::SetError(&this->super_cmCommand,&echo_output);
  }
  else {
    std::operator+(&strdata," called with no value for ",
                   keywordsMissingValue.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::operator+(&echo_output,&strdata,".");
    cmCommand::SetError(&this->super_cmCommand,&echo_output);
  }
  std::__cxx11::string::~string((string *)&echo_output);
  psVar12 = &strdata;
LAB_001c9e8a:
  std::__cxx11::string::~string((string *)psVar12);
LAB_001c9e8f:
  bVar5 = false;
LAB_001c9e91:
  InitialPass::Arguments::~Arguments(&arguments);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&keywordsMissingValue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  return bVar5;
code_r0x001c9f0b:
  p_Var2 = &pvVar14->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  p_Var3 = &pvVar14->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  pvVar14 = pvVar14 + 1;
  if ((p_Var2->_M_impl).super__Vector_impl_data._M_start ==
      (p_Var3->_M_impl).super__Vector_impl_data._M_finish) goto LAB_001c9f1b;
  goto LAB_001c9f02;
LAB_001c9f1b:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&echo_output," given COMMAND argument with no value.",
             (allocator<char> *)&strdata);
  cmCommand::SetError(&this->super_cmCommand,&echo_output);
LAB_001ca1a5:
  psVar12 = &echo_output;
  goto LAB_001c9e8a;
}

Assistant:

bool cmExecuteProcessCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  struct Arguments
  {
    std::vector<std::vector<std::string>> Commands;
    std::string OutputVariable;
    std::string ErrorVariable;
    std::string ResultVariable;
    std::string ResultsVariable;
    std::string WorkingDirectory;
    std::string InputFile;
    std::string OutputFile;
    std::string ErrorFile;
    std::string Timeout;
    std::string CommandEcho;
    bool OutputQuiet = false;
    bool ErrorQuiet = false;
    bool OutputStripTrailingWhitespace = false;
    bool ErrorStripTrailingWhitespace = false;
    std::string Encoding;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("COMMAND"_s, &Arguments::Commands)
      .Bind("COMMAND_ECHO"_s, &Arguments::CommandEcho)
      .Bind("OUTPUT_VARIABLE"_s, &Arguments::OutputVariable)
      .Bind("ERROR_VARIABLE"_s, &Arguments::ErrorVariable)
      .Bind("RESULT_VARIABLE"_s, &Arguments::ResultVariable)
      .Bind("RESULTS_VARIABLE"_s, &Arguments::ResultsVariable)
      .Bind("WORKING_DIRECTORY"_s, &Arguments::WorkingDirectory)
      .Bind("INPUT_FILE"_s, &Arguments::InputFile)
      .Bind("OUTPUT_FILE"_s, &Arguments::OutputFile)
      .Bind("ERROR_FILE"_s, &Arguments::ErrorFile)
      .Bind("TIMEOUT"_s, &Arguments::Timeout)
      .Bind("OUTPUT_QUIET"_s, &Arguments::OutputQuiet)
      .Bind("ERROR_QUIET"_s, &Arguments::ErrorQuiet)
      .Bind("OUTPUT_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::OutputStripTrailingWhitespace)
      .Bind("ERROR_STRIP_TRAILING_WHITESPACE"_s,
            &Arguments::ErrorStripTrailingWhitespace)
      .Bind("ENCODING"_s, &Arguments::Encoding);

  std::vector<std::string> unparsedArguments;
  std::vector<std::string> keywordsMissingValue;
  Arguments const arguments =
    parser.Parse(args, &unparsedArguments, &keywordsMissingValue);

  if (!keywordsMissingValue.empty()) {
    this->SetError(" called with no value for " +
                   keywordsMissingValue.front() + ".");
    return false;
  }
  if (!unparsedArguments.empty()) {
    this->SetError(" given unknown argument \"" + unparsedArguments.front() +
                   "\".");
    return false;
  }

  if (!this->Makefile->CanIWriteThisFile(arguments.OutputFile)) {
    this->SetError("attempted to output into a file: " + arguments.OutputFile +
                   " into a source directory.");
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Check for commands given.
  if (arguments.Commands.empty()) {
    this->SetError(" called with no COMMAND argument.");
    return false;
  }
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    if (cmd.empty()) {
      this->SetError(" given COMMAND argument with no value.");
      return false;
    }
  }

  // Parse the timeout string.
  double timeout = -1;
  if (!arguments.Timeout.empty()) {
    if (sscanf(arguments.Timeout.c_str(), "%lg", &timeout) != 1) {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
    }
  }
  // Create a process instance.
  std::unique_ptr<cmsysProcess, void (*)(cmsysProcess*)> cp_ptr(
    cmsysProcess_New(), cmsysProcess_Delete);
  cmsysProcess* cp = cp_ptr.get();

  // Set the command sequence.
  for (std::vector<std::string> const& cmd : arguments.Commands) {
    std::vector<const char*> argv(cmd.size() + 1);
    std::transform(cmd.begin(), cmd.end(), argv.begin(),
                   [](std::string const& s) { return s.c_str(); });
    argv.back() = nullptr;
    cmsysProcess_AddCommand(cp, argv.data());
  }

  // Set the process working directory.
  if (!arguments.WorkingDirectory.empty()) {
    cmsysProcess_SetWorkingDirectory(cp, arguments.WorkingDirectory.c_str());
  }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if (!arguments.InputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN,
                             arguments.InputFile.c_str());
  }
  if (!arguments.OutputFile.empty()) {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             arguments.OutputFile.c_str());
  }
  if (!arguments.ErrorFile.empty()) {
    if (arguments.ErrorFile == arguments.OutputFile) {
      merge_output = true;
    } else {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               arguments.ErrorFile.c_str());
    }
  }
  if (!arguments.OutputVariable.empty() &&
      arguments.OutputVariable == arguments.ErrorVariable) {
    merge_output = true;
  }
  if (merge_output) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
  }

  // Set the timeout if any.
  if (timeout >= 0) {
    cmsysProcess_SetTimeout(cp, timeout);
  }

  bool echo_stdout = false;
  bool echo_stderr = false;
  bool echo_output_from_variable = true;
  std::string echo_output =
    this->Makefile->GetSafeDefinition("CMAKE_EXECUTE_PROCESS_COMMAND_ECHO");
  if (!arguments.CommandEcho.empty()) {
    echo_output_from_variable = false;
    echo_output = arguments.CommandEcho;
  }

  if (!echo_output.empty()) {
    if (echo_output == "STDERR") {
      echo_stderr = true;
    } else if (echo_output == "STDOUT") {
      echo_stdout = true;
    } else if (echo_output != "NONE") {
      std::string error;
      if (echo_output_from_variable) {
        error = "CMAKE_EXECUTE_PROCESS_COMMAND_ECHO set to '";
      } else {
        error = " called with '";
      }
      error += echo_output;
      error += "' expected STDERR|STDOUT|NONE";
      if (!echo_output_from_variable) {
        error += " for COMMAND_ECHO.";
      }
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, error);
      return true;
    }
  }
  if (echo_stdout || echo_stderr) {
    std::string command;
    for (auto& cmd : arguments.Commands) {
      command += "'";
      command += cmJoin(cmd, "' '");
      command += "'";
      command += "\n";
    }
    if (echo_stdout) {
      std::cout << command;
    } else if (echo_stderr) {
      std::cerr << command;
    }
  }
  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  cmProcessOutput processOutput(
    cmProcessOutput::FindEncoding(arguments.Encoding));
  std::string strdata;
  while ((p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !arguments.OutputQuiet) {
      if (arguments.OutputVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 1);
        cmSystemTools::Stdout(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
      }
    } else if (p == cmsysProcess_Pipe_STDERR && !arguments.ErrorQuiet) {
      if (arguments.ErrorVariable.empty()) {
        processOutput.DecodeText(data, length, strdata, 2);
        cmSystemTools::Stderr(strdata);
      } else {
        cmExecuteProcessCommandAppend(tempError, data, length);
      }
    }
  }
  if (!arguments.OutputQuiet && arguments.OutputVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      cmSystemTools::Stdout(strdata);
    }
  }
  if (!arguments.ErrorQuiet && arguments.ErrorVariable.empty()) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      cmSystemTools::Stderr(strdata);
    }
  }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  processOutput.DecodeText(tempError, tempError);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 arguments.OutputStripTrailingWhitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 arguments.ErrorStripTrailingWhitespace);

  // Store the output obtained.
  if (!arguments.OutputVariable.empty() && !tempOutput.empty()) {
    this->Makefile->AddDefinition(arguments.OutputVariable, tempOutput.data());
  }
  if (!merge_output && !arguments.ErrorVariable.empty() &&
      !tempError.empty()) {
    this->Makefile->AddDefinition(arguments.ErrorVariable, tempError.data());
  }

  // Store the result of running the process.
  if (!arguments.ResultVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[16];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(arguments.ResultVariable, buf);
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }
  // Store the result of running the processes.
  if (!arguments.ResultsVariable.empty()) {
    switch (cmsysProcess_GetState(cp)) {
      case cmsysProcess_State_Exited: {
        std::vector<std::string> res;
        for (size_t i = 0; i < arguments.Commands.size(); ++i) {
          switch (cmsysProcess_GetStateByIndex(cp, static_cast<int>(i))) {
            case kwsysProcess_StateByIndex_Exited: {
              int exitCode =
                cmsysProcess_GetExitValueByIndex(cp, static_cast<int>(i));
              char buf[16];
              sprintf(buf, "%d", exitCode);
              res.emplace_back(buf);
            } break;
            case kwsysProcess_StateByIndex_Exception:
              res.emplace_back(cmsysProcess_GetExceptionStringByIndex(
                cp, static_cast<int>(i)));
              break;
            case kwsysProcess_StateByIndex_Error:
            default:
              res.emplace_back("Error getting the child return code");
              break;
          }
        }
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmJoin(res, ";").c_str());
      } break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(arguments.ResultsVariable,
                                      "Process terminated due to timeout");
        break;
    }
  }

  return true;
}